

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O0

bool wipe_doMelt(int ticks)

{
  short *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BYTE *pBVar6;
  int iVar7;
  int local_40;
  int sy;
  int pitch;
  bool done;
  short *d;
  short *s;
  int x;
  int dy;
  int j;
  int i;
  int ticks_local;
  
  sy._3_1_ = true;
  j = ticks;
  while (iVar7 = j + -1, j != 0) {
    sy._3_1_ = true;
    for (dy = 0; j = iVar7, dy < 0xa0; dy = dy + 1) {
      if (y[dy] < 0) {
        y[dy] = y[dy] + 1;
        sy._3_1_ = false;
      }
      else if (y[dy] < 200) {
        if (y[dy] < 0x10) {
          local_40 = y[dy] + 1;
        }
        else {
          local_40 = 8;
        }
        iVar4 = MIN<int>(y[dy] + local_40,200);
        y[dy] = iVar4;
        sy._3_1_ = false;
      }
      if ((iVar7 == 0) && (-1 < y[dy])) {
        iVar2 = DCanvas::GetPitch((DCanvas *)screen);
        iVar4 = y[dy];
        iVar3 = DCanvas::GetHeight((DCanvas *)screen);
        iVar4 = (iVar4 * iVar3) / 200;
        iVar3 = DCanvas::GetWidth((DCanvas *)screen);
        for (s._4_4_ = (dy * (iVar3 / 2)) / 0xa0; iVar3 = DCanvas::GetWidth((DCanvas *)screen),
            psVar1 = wipe_scr_end, s._4_4_ < ((dy + 1) * (iVar3 / 2)) / 0xa0; s._4_4_ = s._4_4_ + 1)
        {
          iVar3 = DCanvas::GetHeight((DCanvas *)screen);
          pBVar6 = DCanvas::GetBuffer((DCanvas *)screen);
          _pitch = (short *)(pBVar6 + (long)s._4_4_ * 2);
          d = psVar1 + s._4_4_ * iVar3;
          for (x = iVar4; psVar1 = wipe_scr_start, x != 0; x = x + -1) {
            *_pitch = *d;
            _pitch = _pitch + iVar2 / 2;
            d = d + 1;
          }
          iVar3 = DCanvas::GetHeight((DCanvas *)screen);
          iVar5 = DCanvas::GetHeight((DCanvas *)screen);
          d = psVar1 + s._4_4_ * iVar3;
          for (x = iVar5 - iVar4; x != 0; x = x + -1) {
            *_pitch = *d;
            _pitch = _pitch + iVar2 / 2;
            d = d + 1;
          }
        }
      }
    }
  }
  return sy._3_1_;
}

Assistant:

bool wipe_doMelt (int ticks)
{
	int i, j, dy, x;
	const short *s;
	short *d;
	bool done = true;

	while (ticks--)
	{
		done = true;
		for (i = 0; i < MELT_WIDTH; i++)
		{
			if (y[i] < 0)
			{
				y[i]++;
				done = false;
			} 
			else if (y[i] < MELT_HEIGHT)
			{
				dy = (y[i] < 16) ? y[i]+1 : 8;
				y[i] = MIN(y[i] + dy, MELT_HEIGHT);
				done = false;
			}
			if (ticks == 0 && y[i] >= 0)
			{ // Only draw for the final tick.
				const int pitch = screen->GetPitch() / 2;
				int sy = y[i] * SCREENHEIGHT / MELT_HEIGHT;

				for (x = i * (SCREENWIDTH/2) / MELT_WIDTH; x < (i + 1) * (SCREENWIDTH/2) / MELT_WIDTH; ++x)
				{
					s = &wipe_scr_end[x*SCREENHEIGHT];
					d = &((short *)screen->GetBuffer())[x];

					for (j = sy; j != 0; --j)
					{
						*d = *(s++);
						d += pitch;
					}

					s = &wipe_scr_start[x*SCREENHEIGHT];

					for (j = SCREENHEIGHT - sy; j != 0; --j)
					{
						*d = *(s++);
						d += pitch;
					}
				}
			}
		}
	}

	return done;
}